

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPLoader.cpp
# Opt level: O3

void __thiscall Assimp::HMPImporter::CreateOutputFaceList(HMPImporter *this,uint width,uint height)

{
  size_t __n;
  aiMesh *paVar1;
  aiVector3D *paVar2;
  aiVector3D *paVar3;
  float fVar4;
  uint uVar5;
  int iVar6;
  ulong *puVar7;
  aiFace *paVar8;
  aiVector3D *__s;
  uint *puVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  aiVector3D *paVar16;
  aiVector3D *paVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  aiFace *paVar22;
  aiVector3D *local_90;
  aiVector3D *local_80;
  aiVector3D **local_78;
  aiVector3D *local_68;
  
  paVar1 = *((this->super_MDLImporter).pScene)->mMeshes;
  uVar5 = width - 1;
  iVar11 = height - 1;
  uVar15 = iVar11 * uVar5;
  uVar20 = (ulong)uVar15;
  paVar1->mNumFaces = uVar15;
  puVar7 = (ulong *)operator_new__(uVar20 * 0x10 + 8);
  *puVar7 = uVar20;
  paVar22 = (aiFace *)(puVar7 + 1);
  if (uVar15 != 0) {
    paVar8 = paVar22;
    do {
      paVar8->mNumIndices = 0;
      paVar8->mIndices = (uint *)0x0;
      paVar8 = paVar8 + 1;
    } while (paVar8 != paVar22 + uVar20);
  }
  paVar1->mFaces = paVar22;
  uVar15 = uVar15 * 4;
  paVar1->mNumVertices = uVar15;
  uVar20 = (ulong)uVar15 * 0xc;
  __s = (aiVector3D *)operator_new__(uVar20);
  if (uVar15 == 0) {
    local_80 = (aiVector3D *)operator_new__(uVar20);
    if (paVar1->mTextureCoords[0] != (aiVector3D *)0x0) {
      local_90 = (aiVector3D *)operator_new__(uVar20);
      goto LAB_0040d2a6;
    }
  }
  else {
    __n = ((uVar20 - 0xc) / 0xc) * 0xc + 0xc;
    memset(__s,0,__n);
    local_80 = (aiVector3D *)operator_new__(uVar20);
    memset(local_80,0,__n);
    if (paVar1->mTextureCoords[0] != (aiVector3D *)0x0) {
      local_90 = (aiVector3D *)operator_new__(uVar20);
      memset(local_90,0,((uVar20 - 0xc) / 0xc) * 0xc + 0xc);
      goto LAB_0040d2a6;
    }
  }
  local_90 = (aiVector3D *)0x0;
LAB_0040d2a6:
  local_78 = paVar1->mTextureCoords;
  if (iVar11 != 0) {
    iVar12 = 0;
    iVar19 = 0;
    local_68 = local_90;
    paVar16 = __s;
    paVar17 = local_80;
    do {
      if (uVar5 != 0) {
        iVar13 = (iVar12 + 1) * width;
        uVar20 = 0;
        do {
          iVar6 = iVar19;
          paVar22->mNumIndices = 4;
          puVar9 = (uint *)operator_new__(0x10);
          paVar22->mIndices = puVar9;
          paVar2 = paVar1->mVertices;
          iVar19 = (int)uVar20;
          uVar21 = iVar12 * width + iVar19;
          paVar3 = paVar2 + uVar21;
          fVar4 = paVar3->y;
          paVar16->x = paVar3->x;
          paVar16->y = fVar4;
          paVar16->z = paVar2[uVar21].z;
          paVar2 = paVar1->mVertices;
          uVar15 = iVar13 + iVar19;
          paVar3 = paVar2 + uVar15;
          fVar4 = paVar3->y;
          paVar16[1].x = paVar3->x;
          paVar16[1].y = fVar4;
          paVar16[1].z = paVar2[uVar15].z;
          paVar2 = paVar1->mVertices;
          uVar14 = iVar13 + 1 + iVar19;
          paVar3 = paVar2 + uVar14;
          fVar4 = paVar3->y;
          paVar16[2].x = paVar3->x;
          paVar16[2].y = fVar4;
          paVar16[2].z = paVar2[uVar14].z;
          paVar2 = paVar1->mVertices;
          uVar18 = iVar12 * width + 1 + iVar19;
          paVar3 = paVar2 + uVar18;
          fVar4 = paVar3->y;
          paVar16[3].x = paVar3->x;
          paVar16[3].y = fVar4;
          paVar16[3].z = paVar2[uVar18].z;
          paVar2 = paVar1->mNormals;
          paVar3 = paVar2 + uVar21;
          fVar4 = paVar3->y;
          paVar17->x = paVar3->x;
          paVar17->y = fVar4;
          paVar17->z = paVar2[uVar21].z;
          paVar2 = paVar1->mNormals;
          paVar3 = paVar2 + uVar15;
          fVar4 = paVar3->y;
          paVar17[1].x = paVar3->x;
          paVar17[1].y = fVar4;
          paVar17[1].z = paVar2[uVar15].z;
          paVar2 = paVar1->mNormals;
          paVar3 = paVar2 + uVar14;
          fVar4 = paVar3->y;
          paVar17[2].x = paVar3->x;
          paVar17[2].y = fVar4;
          paVar17[2].z = paVar2[uVar14].z;
          paVar2 = paVar1->mNormals;
          paVar3 = paVar2 + uVar18;
          fVar4 = paVar3->y;
          paVar17[3].x = paVar3->x;
          paVar17[3].y = fVar4;
          paVar17[3].z = paVar2[uVar18].z;
          paVar3 = paVar1->mTextureCoords[0];
          if (paVar3 != (aiVector3D *)0x0) {
            local_68->z = paVar3[uVar21].z;
            fVar4 = paVar3[uVar21].y;
            local_68->x = paVar3[uVar21].x;
            local_68->y = fVar4;
            paVar3 = *local_78;
            local_68[1].z = paVar3[uVar15].z;
            paVar3 = paVar3 + uVar15;
            fVar4 = paVar3->y;
            local_68[1].x = paVar3->x;
            local_68[1].y = fVar4;
            paVar3 = *local_78;
            local_68[2].z = paVar3[uVar14].z;
            paVar3 = paVar3 + uVar14;
            fVar4 = paVar3->y;
            local_68[2].x = paVar3->x;
            local_68[2].y = fVar4;
            paVar3 = *local_78;
            local_68[3].z = paVar3[uVar18].z;
            paVar3 = paVar3 + uVar18;
            fVar4 = paVar3->y;
            local_68[3].x = paVar3->x;
            local_68[3].y = fVar4;
            local_68 = local_68 + 4;
          }
          paVar16 = paVar16 + 4;
          paVar17 = paVar17 + 4;
          lVar10 = 0;
          do {
            paVar22->mIndices[lVar10] = iVar6 + (int)lVar10;
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
          uVar20 = uVar20 + 1;
          paVar22 = paVar22 + 1;
          iVar19 = iVar6 + 4;
        } while (uVar20 != uVar5);
        iVar19 = iVar6 + 4;
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 != iVar11);
  }
  if (paVar1->mVertices != (aiVector3D *)0x0) {
    operator_delete__(paVar1->mVertices);
  }
  paVar1->mVertices = __s;
  if (paVar1->mNormals != (aiVector3D *)0x0) {
    operator_delete__(paVar1->mNormals);
  }
  paVar1->mNormals = local_80;
  if (paVar1->mTextureCoords[0] != (aiVector3D *)0x0) {
    operator_delete__(paVar1->mTextureCoords[0]);
    *local_78 = local_90;
  }
  return;
}

Assistant:

void HMPImporter::CreateOutputFaceList(unsigned int width,unsigned int height)
{
    aiMesh* const pcMesh = this->pScene->mMeshes[0];

    // Allocate enough storage
    pcMesh->mNumFaces = (width-1) * (height-1);
    pcMesh->mFaces = new aiFace[pcMesh->mNumFaces];

    pcMesh->mNumVertices   = pcMesh->mNumFaces*4;
    aiVector3D* pcVertices = new aiVector3D[pcMesh->mNumVertices];
    aiVector3D* pcNormals  = new aiVector3D[pcMesh->mNumVertices];

    aiFace* pcFaceOut(pcMesh->mFaces);
    aiVector3D* pcVertOut = pcVertices;
    aiVector3D* pcNorOut = pcNormals;

    aiVector3D* pcUVs = pcMesh->mTextureCoords[0] ? new aiVector3D[pcMesh->mNumVertices] : NULL;
    aiVector3D* pcUVOut(pcUVs);

    // Build the terrain square
    unsigned int iCurrent = 0;
    for (unsigned int y = 0; y < height-1;++y)  {
        for (unsigned int x = 0; x < width-1;++x,++pcFaceOut)   {
            pcFaceOut->mNumIndices = 4;
            pcFaceOut->mIndices = new unsigned int[4];

            *pcVertOut++ = pcMesh->mVertices[y*width+x];
            *pcVertOut++ = pcMesh->mVertices[(y+1)*width+x];
            *pcVertOut++ = pcMesh->mVertices[(y+1)*width+x+1];
            *pcVertOut++ = pcMesh->mVertices[y*width+x+1];


            *pcNorOut++ = pcMesh->mNormals[y*width+x];
            *pcNorOut++ = pcMesh->mNormals[(y+1)*width+x];
            *pcNorOut++ = pcMesh->mNormals[(y+1)*width+x+1];
            *pcNorOut++ = pcMesh->mNormals[y*width+x+1];

            if (pcMesh->mTextureCoords[0])
            {
                *pcUVOut++ = pcMesh->mTextureCoords[0][y*width+x];
                *pcUVOut++ = pcMesh->mTextureCoords[0][(y+1)*width+x];
                *pcUVOut++ = pcMesh->mTextureCoords[0][(y+1)*width+x+1];
                *pcUVOut++ = pcMesh->mTextureCoords[0][y*width+x+1];
            }

            for (unsigned int i = 0; i < 4;++i)
                pcFaceOut->mIndices[i] = iCurrent++;
        }
    }
    delete[] pcMesh->mVertices;
    pcMesh->mVertices = pcVertices;

    delete[] pcMesh->mNormals;
    pcMesh->mNormals = pcNormals;

    if (pcMesh->mTextureCoords[0])
    {
        delete[] pcMesh->mTextureCoords[0];
        pcMesh->mTextureCoords[0] = pcUVs;
    }
}